

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int dwarf_lookup_pc(backtrace_state *state,dwarf_data *ddata,uintptr_t pc,
                   backtrace_full_callback callback,backtrace_error_callback error_callback,
                   void *data,int *found)

{
  ulong *puVar1;
  function_addrs *pfVar2;
  ulong uVar3;
  function *function;
  bool bVar4;
  uintptr_t *puVar5;
  long lVar6;
  long lVar7;
  uchar *puVar8;
  uchar *puVar9;
  backtrace_error_callback error_callback_00;
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  backtrace_state *state_00;
  uint16_t uVar14;
  uint32_t uVar15;
  int iVar16;
  int iVar17;
  unit_addrs *puVar18;
  unit_addrs *puVar19;
  unit_addrs *puVar20;
  size_t sVar21;
  undefined8 *puVar22;
  uint64_t uVar23;
  undefined4 *puVar24;
  function_addrs *pfVar25;
  void *pvVar26;
  void *pvVar27;
  size_t sVar28;
  size_t sVar29;
  char *pcVar30;
  function_addrs *pfVar31;
  int64_t iVar32;
  size_t *__s;
  size_t *__dest;
  int iVar33;
  char *pcVar34;
  ulong uVar35;
  unit *puVar36;
  uint uVar37;
  line *__base;
  backtrace_error_callback error_callback_01;
  char cVar38;
  unit **ppuVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  line_header *hdr;
  long lVar43;
  long lVar44;
  char *pcVar45;
  uint uVar46;
  unit_addrs *puVar47;
  function_vector *vec_function;
  char *local_278;
  char *filename;
  uchar *local_268;
  size_t local_260;
  int local_258;
  backtrace_error_callback local_250;
  void *local_248;
  int local_240;
  size_t local_1a8;
  char *local_1a0;
  undefined1 local_198 [24];
  size_t sStack_180;
  unit *local_170;
  size_t *local_168;
  dwarf_buf local_160;
  size_t *local_120;
  undefined1 auStack_118 [8];
  function_vector lvec;
  undefined1 auStack_d8 [8];
  int lineno;
  uint uStack_cc;
  int local_c8;
  uint uStack_c4;
  uint uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  char **local_98 [2];
  uintptr_t local_88;
  uintptr_t pc_local;
  size_t *local_78;
  function_vector *local_70;
  backtrace_full_callback local_68;
  size_t local_60;
  uint64_t local_58;
  void *local_50;
  backtrace_error_callback local_48;
  backtrace_state *local_40;
  unit *local_38;
  
  *found = 1;
  local_88 = pc;
  local_40 = state;
  if (pc == 0xffffffffffffffff || ddata->addrs_count == 0) {
    pvVar26 = (void *)0x0;
  }
  else {
    pvVar26 = bsearch(&local_88,ddata->addrs,ddata->addrs_count,0x18,unit_addrs_search);
  }
  if (pvVar26 != (void *)0x0) {
    puVar18 = (unit_addrs *)((long)pvVar26 - 0x30);
    do {
      puVar19 = puVar18 + 1;
      puVar47 = puVar18 + 3;
      puVar18 = puVar19;
    } while (local_88 == puVar47->low);
    do {
      puVar18 = puVar19 + 1;
      if (local_88 < puVar19[1].high) {
        puVar36 = puVar19[1].u;
        __base = puVar36->lines;
        local_48 = error_callback;
        if ((puVar18 <= ddata->addrs) || (local_88 < puVar19->low)) goto LAB_00130b4c;
        ppuVar39 = &puVar19->u;
        puVar47 = puVar18;
        goto LAB_00130adc;
      }
    } while ((puVar18 != ddata->addrs) &&
            (puVar5 = &puVar19->low, puVar18 = puVar19 + 1, puVar19 = puVar19 + -1,
            puVar18->low <= *puVar5));
  }
  *found = 0;
  return 0;
  while( true ) {
    if (local_40->threaded != 0) goto LAB_00131d9f;
    puVar18 = puVar47;
    if (__base != (line *)0xffffffffffffffff) break;
    puVar47 = (unit_addrs *)(ppuVar39 + -2);
    puVar36 = *ppuVar39;
    __base = puVar36->lines;
    puVar18 = puVar20;
    if (puVar47 <= ddata->addrs) break;
    puVar1 = (ulong *)(ppuVar39 + -5);
    puVar19 = puVar20 + -1;
    ppuVar39 = ppuVar39 + -3;
    puVar18 = puVar47;
    puVar47 = puVar20;
    if (local_88 < *puVar1) break;
LAB_00130adc:
    puVar20 = puVar19;
    if (ppuVar39[-1] <= local_88) {
      puVar18 = (unit_addrs *)(ppuVar39 + 1);
      break;
    }
  }
LAB_00130b4c:
  if (local_40->threaded != 0) goto LAB_00131d9f;
  cVar38 = '\x01';
  if (__base == (line *)0x0) {
    local_198._0_16_ = (undefined1  [16])0x0;
    stack0xfffffffffffffe78 = (undefined1  [16])0x0;
    _auStack_d8 = (undefined1  [16])0x0;
    _local_c8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_98[0] = (char **)0x0;
    uVar35 = puVar18->u->lineoff;
    uVar3 = (ddata->dwarf_sections).size[1];
    sVar21 = uVar3 - uVar35;
    local_170 = puVar36;
    pc_local = (uintptr_t)ddata;
    local_50 = data;
    if (uVar3 < uVar35 || sVar21 == 0) {
      (*error_callback)(data,"unit line offset out of range",0);
      error_callback_01 = error_callback;
LAB_00131344:
      state_00 = local_40;
      local_198._16_8_ = local_198._16_8_ + local_198._8_8_;
      local_198._8_8_ = 0;
      tcmalloc_backtrace_vector_release
                (local_40,(backtrace_vector *)local_198,error_callback_01,data);
      hdr = (line_header *)auStack_d8;
      free_line_header(state_00,hdr,error_callback_01,data);
      uVar35 = CONCAT71((int7)((ulong)hdr >> 8),1);
      __base = (line *)0xffffffffffffffff;
      sVar21 = 0;
    }
    else {
      local_160.name = ".debug_line";
      local_160.start = (ddata->dwarf_sections).data[1];
      local_160.buf = local_160.start + uVar35;
      local_160.is_bigendian = ddata->is_bigendian;
      local_160.reported_underflow = 0;
      local_160.left = sVar21;
      local_160.error_callback = error_callback;
      local_160.data = data;
      local_38 = puVar18->u;
      uVar15 = read_uint32(&local_160);
      if (uVar15 == 0xffffffff) {
        local_160.left = read_uint64(&local_160);
      }
      else {
        local_160.left = (size_t)uVar15;
      }
      uVar14 = read_uint16(&local_160);
      auVar11 = _auStack_d8;
      puVar8 = local_160.buf;
      auStack_d8._0_4_ = CONCAT22(0,uVar14);
      if ((ushort)(uVar14 - 6) < 0xfffc) {
        uVar46 = (int)local_160.buf - (int)local_160.start;
        pcVar34 = "unsupported line number version";
LAB_00130c85:
        snprintf((char *)&stack0xfffffffffffffd88,200,"%s in %s at %d",pcVar34,local_160.name,
                 (ulong)uVar46);
        (*local_160.error_callback)(local_160.data,(char *)&stack0xfffffffffffffd88,-1);
        error_callback_01 = local_48;
        goto LAB_00131344;
      }
      if (uVar14 == 5) {
        iVar17 = advance(&local_160,1);
        puVar9 = local_160.buf;
        if (iVar17 == 0) {
          uVar46 = 0;
        }
        else {
          uVar46 = (uint)*puVar8;
        }
        auStack_d8._4_4_ = uVar46;
        iVar17 = advance(&local_160,1);
        if ((iVar17 != 0) && (*puVar9 != 0)) {
          uVar46 = (int)local_160.buf - (int)local_160.start;
          pcVar34 = "non-zero segment_selector_size not supported";
          goto LAB_00130c85;
        }
      }
      else {
        _lineno = auVar11._8_8_;
        auStack_d8._4_4_ = local_38->addrsize;
      }
      if (uVar15 == 0xffffffff) {
        lvec.vec.alc = read_uint64(&local_160);
      }
      else {
        uVar15 = read_uint32(&local_160);
        lvec.vec.alc = (size_t)uVar15;
      }
      iVar17 = local_160.reported_underflow;
      pvVar26 = local_160.data;
      error_callback_00 = local_160.error_callback;
      lvec.count = CONCAT44(local_160._36_4_,local_160.is_bigendian);
      lvec.vec.base = local_160.start;
      auStack_118 = (undefined1  [8])local_160.name;
      lvec.vec.size = (size_t)local_160.buf;
      iVar16 = advance(&local_160,lvec.vec.alc);
      error_callback_01 = local_48;
      if (iVar16 == 0) goto LAB_00131344;
      sVar21 = lvec.vec.size;
      iVar16 = advance((dwarf_buf *)auStack_118,1);
      auVar11 = _auStack_d8;
      if (iVar16 == 0) {
        uVar46 = 0;
      }
      else {
        uVar46 = (uint)*(byte *)sVar21;
      }
      lineno = uVar46;
      auVar10 = _auStack_d8;
      auVar12 = _auStack_d8;
      uStack_cc = 1;
      auStack_d8._0_4_ = auVar11._0_4_;
      bVar4 = 3 < (int)auStack_d8._0_4_;
      _auStack_d8 = auVar10;
      if (bVar4) {
        sVar21 = lvec.vec.size;
        _auStack_d8 = auVar12;
        iVar16 = advance((dwarf_buf *)auStack_118,1);
        if (iVar16 == 0) {
          uStack_cc = 0;
        }
        else {
          uStack_cc = (uint)*(byte *)sVar21;
        }
      }
      advance((dwarf_buf *)auStack_118,1);
      sVar21 = lvec.vec.size;
      iVar16 = advance((dwarf_buf *)auStack_118,1);
      uVar46 = 0;
      iVar33 = 0;
      if (iVar16 != 0) {
        iVar33 = (int)*(char *)sVar21;
      }
      local_c8 = iVar33;
      sVar21 = lvec.vec.size;
      iVar16 = advance((dwarf_buf *)auStack_118,1);
      if (iVar16 != 0) {
        uVar46 = (uint)*(byte *)sVar21;
      }
      uStack_c4 = uVar46;
      sVar21 = lvec.vec.size;
      iVar16 = advance((dwarf_buf *)auStack_118,1);
      if (iVar16 == 0) {
        uVar46 = 0;
      }
      else {
        uVar46 = (uint)*(byte *)sVar21;
      }
      uStack_c0 = uVar46;
      local_b8._0_8_ = lvec.vec.size;
      iVar16 = advance((dwarf_buf *)auStack_118,(ulong)(uVar46 - 1));
      error_callback_01 = local_48;
      if (iVar16 == 0) goto LAB_00131344;
      if ((int)auStack_d8._0_4_ < 5) {
        local_b8._8_8_ = 0;
        sVar21 = lvec.vec.size;
        if (0 < (long)lvec.vec.alc) {
          pcVar34 = (char *)lvec.vec.size;
          do {
            if (*pcVar34 == '\0') break;
            lVar43 = (long)(lvec.vec.alc + lvec.vec.size) - (long)pcVar34;
            if (lVar43 == 0) {
              lVar41 = 1;
            }
            else {
              lVar40 = 0;
              do {
                lVar41 = lVar40;
                if (pcVar34[lVar40] == '\0') break;
                lVar40 = lVar40 + 1;
                lVar41 = lVar43;
              } while (lVar43 != lVar40);
              lVar41 = lVar41 + 1;
            }
            pcVar34 = pcVar34 + lVar41;
            local_b8._8_8_ = local_b8._8_8_ + 1;
          } while (pcVar34 < (char *)(lvec.vec.alc + lvec.vec.size));
        }
        uVar13 = local_b8._8_8_;
        local_b8._8_8_ = local_b8._8_8_ + 1;
        puVar22 = (undefined8 *)
                  tcmalloc_backtrace_alloc(local_40,uVar13 * 8 + 8,error_callback_00,pvVar26);
        local_a8._0_8_ = puVar22;
        error_callback_01 = local_48;
        if (puVar22 != (undefined8 *)0x0) {
          *puVar22 = local_38->comp_dir;
          if (*(char *)sVar21 != '\0') {
            lVar43 = 8;
            do {
              error_callback_01 = local_48;
              if (iVar17 != 0) goto LAB_00131344;
              pcVar34 = read_string((dwarf_buf *)auStack_118);
              *(char **)(local_a8._0_8_ + lVar43) = pcVar34;
              error_callback_01 = local_48;
              if (*(long *)(local_a8._0_8_ + lVar43) == 0) goto LAB_00131344;
              lVar43 = lVar43 + 8;
            } while (*(char *)lvec.vec.size != '\0');
          }
          iVar16 = advance((dwarf_buf *)auStack_118,1);
          error_callback_01 = local_48;
          if (iVar16 != 0) {
            local_a8._8_8_ = 0;
            if (0 < (long)lvec.vec.alc) {
              pcVar34 = (char *)lvec.vec.size;
              do {
                if (*pcVar34 == '\0') break;
                lVar43 = 1;
                lVar41 = 1;
                lVar40 = (long)(lvec.vec.alc + lvec.vec.size) - (long)pcVar34;
                if (lVar40 != 0) {
                  lVar44 = 0;
                  do {
                    lVar41 = lVar44;
                    if (pcVar34[lVar44] == '\0') break;
                    lVar44 = lVar44 + 1;
                    lVar41 = lVar40;
                  } while (lVar40 != lVar44);
                  lVar41 = lVar41 + 1;
                }
                if (pcVar34[lVar41] < '\0') {
                  lVar40 = 1;
                  do {
                    lVar43 = lVar40 + 1;
                    lVar44 = lVar40 + lVar41;
                    lVar40 = lVar43;
                  } while (pcVar34[lVar44] < '\0');
                }
                lVar6 = lVar43 + lVar41;
                lVar44 = 1;
                lVar40 = 1;
                if (pcVar34[lVar43 + lVar41] < '\0') {
                  lVar42 = 1;
                  do {
                    lVar40 = lVar42 + 1;
                    lVar7 = lVar42 + lVar6;
                    lVar42 = lVar40;
                  } while (pcVar34[lVar7] < '\0');
                }
                if (pcVar34[lVar40 + lVar6] < '\0') {
                  lVar42 = 1;
                  do {
                    lVar44 = lVar42 + 1;
                    lVar7 = lVar42 + lVar43 + lVar40 + lVar41;
                    lVar42 = lVar44;
                  } while (pcVar34[lVar7] < '\0');
                }
                pcVar34 = pcVar34 + lVar44 + lVar40 + lVar6;
                local_a8._8_8_ = local_a8._8_8_ + 1;
              } while (pcVar34 < (char *)(lvec.vec.alc + lvec.vec.size));
            }
            uVar13 = local_a8._8_8_;
            local_a8._8_8_ = local_a8._8_8_ + 1;
            local_98[0] = (char **)tcmalloc_backtrace_alloc
                                             (local_40,uVar13 * 8 + 8,error_callback_00,pvVar26);
            error_callback_01 = local_48;
            if (local_98[0] != (char **)0x0) {
              *local_98[0] = local_38->filename;
              local_38 = (unit *)0x1;
              do {
                if (*(char *)lvec.vec.size == '\0') goto LAB_0013130d;
                if ((iVar17 == 0) &&
                   (pcVar34 = read_string((dwarf_buf *)auStack_118), pcVar34 != (char *)0x0)) {
                  uVar23 = read_uleb128((dwarf_buf *)auStack_118);
                  if (*pcVar34 != '/') {
                    if ((ulong)local_b8._8_8_ <= uVar23) {
                      snprintf((char *)&stack0xfffffffffffffd88,200,"%s in %s at %d",
                               "invalid directory index in line number program header",auStack_118,
                               (ulong)(uint)((int)lvec.vec.size - (int)lvec.vec.base));
                      (*error_callback_00)(pvVar26,(char *)&stack0xfffffffffffffd88,0);
LAB_0013123c:
                      bVar4 = false;
                      goto LAB_0013111f;
                    }
                    pcVar45 = *(char **)(local_a8._0_8_ + uVar23 * 8);
                    data = local_50;
                    if (pcVar45 != (char *)0x0) {
                      local_68 = callback;
                      sVar28 = strlen(pcVar45);
                      sVar29 = strlen(pcVar34);
                      local_58 = sVar28;
                      pcVar30 = (char *)tcmalloc_backtrace_alloc
                                                  (local_40,sVar28 + sVar29 + 2,error_callback_00,
                                                   pvVar26);
                      uVar23 = local_58;
                      callback = local_68;
                      data = local_50;
                      if (pcVar30 == (char *)0x0) goto LAB_0013123c;
                      memcpy(pcVar30,pcVar45,local_58);
                      pcVar30[uVar23] = '/';
                      memcpy(pcVar30 + uVar23 + 1,pcVar34,sVar29 + 1);
                      pcVar34 = pcVar30;
                      callback = local_68;
                      data = local_50;
                    }
                  }
                  puVar36 = local_38;
                  local_98[0][(long)local_38] = pcVar34;
                  read_uleb128((dwarf_buf *)auStack_118);
                  read_uleb128((dwarf_buf *)auStack_118);
                  local_38 = (unit *)((long)&puVar36->unit_data + 1);
                  bVar4 = true;
                }
                else {
                  bVar4 = false;
                }
LAB_0013111f:
                error_callback_01 = local_48;
              } while (bVar4);
            }
          }
        }
        goto LAB_00131344;
      }
      iVar16 = read_line_header_format_entries
                         (local_40,(dwarf_data *)pc_local,local_38,(dwarf_buf *)auStack_118,
                          (line_header *)auStack_d8,(size_t *)(local_b8 + 8),(char ***)local_a8);
      error_callback_01 = local_48;
      if ((iVar16 == 0) ||
         (iVar16 = read_line_header_format_entries
                             (local_40,(dwarf_data *)pc_local,local_38,(dwarf_buf *)auStack_118,
                              (line_header *)auStack_d8,(size_t *)(local_a8 + 8),local_98),
         error_callback_01 = local_48, iVar16 == 0)) goto LAB_00131344;
LAB_0013130d:
      error_callback_01 = local_48;
      if (iVar17 != 0) goto LAB_00131344;
      if ((ulong)local_a8._8_8_ < 2) {
        local_168 = (size_t *)0x1353e0;
      }
      else {
        local_168 = (size_t *)local_98[0][1];
      }
      local_60 = CONCAT44(local_60._4_4_,1);
      local_38 = (unit *)0x0;
      local_58 = 0;
      local_78 = local_168;
      local_68 = callback;
      do {
        sVar21 = local_160.left;
        puVar8 = local_160.buf;
        if (local_160.left == 0) break;
        iVar17 = advance(&local_160,1);
        error_callback_01 = local_48;
        if (iVar17 == 0) {
          uVar46 = 0;
        }
        else {
          uVar46 = (uint)*puVar8;
        }
        if (uStack_c0 <= uVar46) {
          uVar37 = (uVar46 - uStack_c0) / uStack_c4 + (int)local_38;
          local_38 = (unit *)((ulong)uVar37 % (ulong)uStack_cc);
          local_58 = local_58 + (ulong)(lineno * uVar37) / (ulong)uStack_cc;
          iVar17 = (uint)local_60 + local_c8 + (uVar46 - uStack_c0) % uStack_c4;
          local_60 = CONCAT44(local_60._4_4_,iVar17);
LAB_00131944:
          add_line(local_40,(dwarf_data *)pc_local,local_58,(char *)local_78,iVar17,
                   local_160.error_callback,local_160.data,(line_vector *)local_198);
          goto switchD_001318d4_caseD_6;
        }
        switch((ulong)uVar46) {
        case 0:
          local_70 = (function_vector *)read_uleb128(&local_160);
          puVar8 = local_160.buf;
          iVar17 = advance(&local_160,1);
          puVar36 = (unit *)0x0;
          if (iVar17 == 0) {
            uVar46 = 0;
          }
          else {
            uVar46 = (uint)*puVar8;
          }
          switch(uVar46) {
          case 1:
            local_78 = local_168;
            local_58 = 0;
            goto LAB_00131be1;
          case 2:
            local_58 = read_address(&local_160,auStack_d8._4_4_);
            break;
          case 3:
            __s = (size_t *)read_string(&local_160);
            if (__s == (size_t *)0x0) {
LAB_00131cb8:
              bVar4 = false;
              __s = local_78;
            }
            else {
              local_70 = (function_vector *)read_uleb128(&local_160);
              read_uleb128(&local_160);
              read_uleb128(&local_160);
              bVar4 = true;
              if ((char)*__s != '/') {
                if (((ulong)local_70 & 0xffffffff) < (ulong)local_b8._8_8_) {
                  local_1a0 = *(char **)(local_a8._0_8_ + ((ulong)local_70 & 0xffffffff) * 8);
                  local_70 = (function_vector *)strlen(local_1a0);
                  local_1a8 = strlen((char *)__s);
                  __dest = (size_t *)
                           tcmalloc_backtrace_alloc
                                     (local_40,(long)&(local_70->vec).base + local_1a8 + 2,
                                      local_160.error_callback,local_160.data);
                  if (__dest == (size_t *)0x0) goto LAB_00131cb8;
                  local_120 = __dest;
                  memcpy(__dest,local_1a0,(size_t)local_70);
                  *(undefined1 *)((long)local_120 + (long)local_70) = 0x2f;
                  memcpy((void *)((long)local_120 + (long)local_70 + 1),__s,local_1a8 + 1);
                  local_78 = local_120;
                  __s = local_78;
                }
                else {
                  bVar4 = false;
                  dwarf_buf_error(&local_160,"invalid directory index in line number program",0);
                  __s = local_78;
                }
              }
            }
            local_78 = __s;
            if (bVar4) {
              puVar36 = local_38;
              uVar46 = (uint)local_60;
              goto LAB_00131be1;
            }
            bVar4 = false;
            goto LAB_00131bea;
          case 4:
            read_uleb128(&local_160);
            break;
          default:
            iVar17 = advance(&local_160,(size_t)((long)&local_70[-1].count + 7));
            if (iVar17 == 0) {
              bVar4 = false;
              goto LAB_00131bea;
            }
          }
          puVar36 = local_38;
          uVar46 = (uint)local_60;
LAB_00131be1:
          bVar4 = true;
          local_60 = CONCAT44(local_60._4_4_,uVar46);
          local_38 = puVar36;
LAB_00131bea:
          error_callback_01 = local_48;
          if (bVar4) break;
          bVar4 = false;
          goto LAB_00131960;
        case 1:
          iVar17 = (uint)local_60;
          goto LAB_00131944;
        case 2:
          uVar23 = read_uleb128(&local_160);
          uVar35 = uVar23 + ((ulong)local_38 & 0xffffffff);
          local_58 = local_58 + ((uint)lineno * uVar35) / (ulong)uStack_cc;
          local_38 = (unit *)(uVar35 % (ulong)uStack_cc);
          break;
        case 3:
          iVar32 = read_sleb128(&local_160);
          local_60 = CONCAT44(local_60._4_4_,(uint)local_60 + (int)iVar32);
          break;
        case 4:
          uVar23 = read_uleb128(&local_160);
          if (uVar23 < (ulong)local_a8._8_8_) {
            local_78 = (size_t *)local_98[0][uVar23];
            error_callback_01 = local_48;
            break;
          }
          snprintf((char *)&stack0xfffffffffffffd88,200,"%s in %s at %d",
                   "invalid file number in line number program",local_160.name,
                   (ulong)(uint)((int)local_160.buf - (int)local_160.start));
          (*local_160.error_callback)(local_160.data,(char *)&stack0xfffffffffffffd88,0);
          bVar4 = false;
          error_callback_01 = local_48;
          goto LAB_00131960;
        case 5:
        case 0xc:
          read_uleb128(&local_160);
        case 6:
        case 7:
        case 10:
        case 0xb:
switchD_001318d4_caseD_6:
          break;
        case 8:
          uVar46 = (0xff - uStack_c0) / uStack_c4 + (int)local_38;
          local_58 = local_58 + (ulong)(lineno * uVar46) / (ulong)uStack_cc;
          local_38 = (unit *)((ulong)uVar46 % (ulong)uStack_cc);
          goto switchD_001318d4_caseD_6;
        case 9:
          uVar14 = read_uint16(&local_160);
          local_58 = local_58 + uVar14;
          local_38 = (unit *)0x0;
          break;
        default:
          uVar37 = (uint)*(byte *)(local_b8._0_8_ + ((ulong)uVar46 - 1));
          if (*(byte *)(local_b8._0_8_ + ((ulong)uVar46 - 1)) == 0) goto switchD_001318d4_caseD_6;
          do {
            read_uleb128(&local_160);
            uVar37 = uVar37 - 1;
            error_callback_01 = local_48;
          } while (uVar37 != 0);
        }
        bVar4 = true;
LAB_00131960:
      } while (bVar4);
      data = local_50;
      callback = local_68;
      if ((((sVar21 != 0) || (local_160.reported_underflow != 0)) || (sStack_180 == 0)) ||
         (puVar22 = (undefined8 *)
                    tcmalloc_backtrace_vector_grow
                              (local_40,0x18,error_callback_01,local_50,
                               (backtrace_vector *)local_198), puVar22 == (undefined8 *)0x0))
      goto LAB_00131344;
      *puVar22 = 0xffffffffffffffff;
      *(undefined1 (*) [16])(puVar22 + 1) = (undefined1  [16])0x0;
      iVar17 = tcmalloc_backtrace_vector_release
                         (local_40,(backtrace_vector *)local_198,error_callback_01,data);
      if (iVar17 == 0) goto LAB_00131344;
      __base = (line *)local_198._0_8_;
      tcmalloc_backtrace_qsort((void *)local_198._0_8_,sStack_180,0x18,line_compare);
      uVar35 = 0;
      sVar21 = sStack_180;
    }
    pfVar25 = (function_addrs *)0x0;
    local_38 = (unit *)0x0;
    if ((char)uVar35 == '\0') {
      local_58 = CONCAT44(local_58._4_4_,(int)uVar35);
      iVar17 = local_40->threaded;
      local_70 = (function_vector *)0x0;
      if (iVar17 == 0) {
        local_70 = (function_vector *)(pc_local + 0xd0);
      }
      local_120 = &local_70->count;
      puVar36 = puVar18->u;
      local_168 = (size_t *)CONCAT44(local_168._4_4_,iVar17);
      local_78 = local_120;
      vec_function = local_70;
      if (iVar17 != 0) {
        local_78 = &lvec.vec.alc;
        lvec.vec.size = 0;
        lvec.vec.alc = 0;
        _auStack_118 = (undefined1  [16])0x0;
        vec_function = (function_vector *)auStack_118;
      }
      local_278 = ".debug_info";
      filename = *(char **)(pc_local + 0x38);
      local_268 = puVar36->unit_data;
      local_260 = puVar36->unit_data_len;
      local_258 = *(int *)(pc_local + 200);
      local_250 = local_48;
      local_248 = local_50;
      local_240 = 0;
      local_38 = (unit *)0x0;
      local_68 = callback;
      local_60 = sVar21;
      do {
        if (local_260 == 0) {
          if (*local_78 == 0) {
            pfVar25 = (function_addrs *)0x0;
            local_38 = (unit *)0x0;
            callback = local_68;
          }
          else {
            puVar24 = (undefined4 *)
                      tcmalloc_backtrace_vector_grow
                                (local_40,0x18,local_48,local_50,&vec_function->vec);
            callback = local_68;
            if (puVar24 == (undefined4 *)0x0) {
LAB_0013158c:
              pfVar25 = (function_addrs *)0x0;
              local_38 = (unit *)0x0;
            }
            else {
              *puVar24 = 0xffffffff;
              puVar24[1] = 0xffffffff;
              puVar24[2] = 0xffffffff;
              puVar24[3] = 0xffffffff;
              *(undefined8 *)(puVar24 + 4) = 0;
              local_38 = (unit *)*local_78;
              if ((int)local_168 == 0) {
                pfVar25 = (function_addrs *)
                          tcmalloc_backtrace_vector_finish
                                    (local_40,&local_70->vec,local_48,local_50);
                if (pfVar25 == (function_addrs *)0x0) goto LAB_0013158c;
                *local_120 = 0;
              }
              else {
                iVar17 = tcmalloc_backtrace_vector_release
                                   (local_40,(backtrace_vector *)auStack_118,local_48,local_50);
                if (iVar17 == 0) goto LAB_0013158c;
                pfVar25 = (function_addrs *)(vec_function->vec).base;
              }
              tcmalloc_backtrace_qsort(pfVar25,(size_t)local_38,0x18,function_addrs_compare);
            }
          }
          goto LAB_00131597;
        }
        iVar17 = read_function_entry(local_40,(dwarf_data *)pc_local,puVar36,0,
                                     (dwarf_buf *)&stack0xfffffffffffffd88,(line_header *)auStack_d8
                                     ,local_48,local_50,vec_function,vec_function);
      } while (iVar17 != 0);
      pfVar25 = (function_addrs *)0x0;
      callback = local_68;
LAB_00131597:
      free_line_header(local_40,(line_header *)auStack_d8,local_48,local_50);
      uVar35 = local_58 & 0xffffffff;
      sVar21 = local_60;
    }
    cVar38 = (char)uVar35;
    if (local_40->threaded != 0) {
LAB_00131d9f:
      abort();
    }
    local_170->lines_count = sVar21;
    local_170->function_addrs = pfVar25;
    local_170->function_addrs_count = (size_t)local_38;
    local_170->lines = __base;
    ddata = (dwarf_data *)pc_local;
    data = local_50;
  }
  if (__base == (line *)0xffffffffffffffff) {
    if (cVar38 == '\0') {
      iVar17 = dwarf_lookup_pc(local_40,ddata,local_88,callback,local_48,data,found);
      return iVar17;
    }
    pcVar34 = (char *)0x0;
LAB_00131839:
    iVar17 = 0;
  }
  else {
    pvVar26 = bsearch(&local_88,__base,puVar18->u->lines_count,0x18,line_search);
    puVar36 = puVar18->u;
    if (pvVar26 == (void *)0x0) {
      if (puVar36->abs_filename == (char *)0x0) {
        pcVar34 = puVar36->filename;
        if (pcVar34 == (char *)0x0) {
          pcVar34 = (char *)0x0;
        }
        else if ((*pcVar34 != '/') &&
                (pcVar45 = puVar36->comp_dir, local_50 = data, pcVar45 != (char *)0x0)) {
          local_68 = callback;
          sVar28 = strlen(pcVar34);
          sVar29 = strlen(pcVar45);
          pc_local = sVar28;
          pcVar30 = (char *)tcmalloc_backtrace_alloc(local_40,sVar28 + sVar29 + 2,local_48,local_50)
          ;
          if (pcVar30 == (char *)0x0) {
            *found = 0;
            return 0;
          }
          memcpy(pcVar30,pcVar45,sVar29);
          pcVar30[sVar29] = '/';
          memcpy(pcVar30 + sVar29 + 1,pcVar34,pc_local + 1);
          pcVar34 = pcVar30;
          callback = local_68;
          data = local_50;
        }
        puVar18->u->abs_filename = pcVar34;
      }
      pcVar34 = puVar18->u->abs_filename;
      goto LAB_00131839;
    }
    if ((puVar36->function_addrs_count != 0) &&
       (pvVar27 = bsearch(&local_88,puVar36->function_addrs,puVar36->function_addrs_count,0x18,
                          function_addrs_search), pvVar27 != (void *)0x0)) {
      pfVar25 = (function_addrs *)((long)pvVar27 + -0x18);
      do {
        pfVar31 = pfVar25 + 1;
        pfVar2 = pfVar25 + 2;
        pfVar25 = pfVar31;
      } while (local_88 == pfVar2->low);
      do {
        if (local_88 < pfVar31->high) goto LAB_0013179b;
      } while ((pfVar31 != puVar18->u->function_addrs) &&
              (pfVar25 = pfVar31 + -1, puVar5 = &pfVar31->low, pfVar31 = pfVar31 + -1,
              *puVar5 <= pfVar25->low));
      pfVar31 = (function_addrs *)0x0;
LAB_0013179b:
      if (pfVar31 != (function_addrs *)0x0) {
        function = pfVar31->function;
        local_278 = *(char **)((long)pvVar26 + 8);
        auStack_d8._0_4_ = *(undefined4 *)((long)pvVar26 + 0x10);
        iVar17 = report_inlined_functions
                           (local_88,function,callback,data,&stack0xfffffffffffffd88,
                            (int *)auStack_d8);
        if (iVar17 != 0) {
          return iVar17;
        }
        pcVar45 = function->name;
        pcVar34 = local_278;
        iVar17 = auStack_d8._0_4_;
        goto LAB_0013183e;
      }
    }
    pcVar34 = *(char **)((long)pvVar26 + 8);
    iVar17 = *(int *)((long)pvVar26 + 0x10);
  }
  pcVar45 = (char *)0x0;
LAB_0013183e:
  iVar17 = (*callback)(data,local_88,pcVar34,iVar17,pcVar45);
  return iVar17;
}

Assistant:

static int
dwarf_lookup_pc (struct backtrace_state *state, struct dwarf_data *ddata,
		 uintptr_t pc, backtrace_full_callback callback,
		 backtrace_error_callback error_callback, void *data,
		 int *found)
{
  struct unit_addrs *entry;
  int found_entry;
  struct unit *u;
  int new_data;
  struct line *lines;
  struct line *ln;
  struct function_addrs *p;
  struct function_addrs *fmatch;
  struct function *function;
  const char *filename;
  int lineno;
  int ret;

  *found = 1;

  /* Find an address range that includes PC.  Our search isn't safe if
     PC == -1, as we use that as a sentinel value, so skip the search
     in that case.  */
  entry = (ddata->addrs_count == 0 || pc + 1 == 0
	   ? NULL
	   : bsearch (&pc, ddata->addrs, ddata->addrs_count,
		      sizeof (struct unit_addrs), unit_addrs_search));

  if (entry == NULL)
    {
      *found = 0;
      return 0;
    }

  /* Here pc >= entry->low && pc < (entry + 1)->low.  The unit_addrs
     are sorted by low, so if pc > p->low we are at the end of a range
     of unit_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (entry + 1)->low)
    ++entry;
  found_entry = 0;
  while (1)
    {
      if (pc < entry->high)
	{
	  found_entry = 1;
	  break;
	}
      if (entry == ddata->addrs)
	break;
      if ((entry - 1)->low < entry->low)
	break;
      --entry;
    }
  if (!found_entry)
    {
      *found = 0;
      return 0;
    }

  /* We need the lines, lines_count, function_addrs,
     function_addrs_count fields of u.  If they are not set, we need
     to set them.  When running in threaded mode, we need to allow for
     the possibility that some other thread is setting them
     simultaneously.  */

  u = entry->u;
  lines = u->lines;

  /* Skip units with no useful line number information by walking
     backward.  Useless line number information is marked by setting
     lines == -1.  */
  while (entry > ddata->addrs
	 && pc >= (entry - 1)->low
	 && pc < (entry - 1)->high)
    {
      if (state->threaded)
	lines = (struct line *) backtrace_atomic_load_pointer (&u->lines);

      if (lines != (struct line *) (uintptr_t) -1)
	break;

      --entry;

      u = entry->u;
      lines = u->lines;
    }

  if (state->threaded)
    lines = backtrace_atomic_load_pointer (&u->lines);

  new_data = 0;
  if (lines == NULL)
    {
      struct function_addrs *function_addrs;
      size_t function_addrs_count;
      struct line_header lhdr;
      size_t count;

      /* We have never read the line information for this unit.  Read
	 it now.  */

      function_addrs = NULL;
      function_addrs_count = 0;
      if (read_line_info (state, ddata, error_callback, data, entry->u, &lhdr,
			  &lines, &count))
	{
	  struct function_vector *pfvec;

	  /* If not threaded, reuse DDATA->FVEC for better memory
	     consumption.  */
	  if (state->threaded)
	    pfvec = NULL;
	  else
	    pfvec = &ddata->fvec;
	  read_function_info (state, ddata, &lhdr, error_callback, data,
			      entry->u, pfvec, &function_addrs,
			      &function_addrs_count);
	  free_line_header (state, &lhdr, error_callback, data);
	  new_data = 1;
	}

      /* Atomically store the information we just read into the unit.
	 If another thread is simultaneously writing, it presumably
	 read the same information, and we don't care which one we
	 wind up with; we just leak the other one.  We do have to
	 write the lines field last, so that the acquire-loads above
	 ensure that the other fields are set.  */

      if (!state->threaded)
	{
	  u->lines_count = count;
	  u->function_addrs = function_addrs;
	  u->function_addrs_count = function_addrs_count;
	  u->lines = lines;
	}
      else
	{
	  backtrace_atomic_store_size_t (&u->lines_count, count);
	  backtrace_atomic_store_pointer (&u->function_addrs, function_addrs);
	  backtrace_atomic_store_size_t (&u->function_addrs_count,
					 function_addrs_count);
	  backtrace_atomic_store_pointer (&u->lines, lines);
	}
    }

  /* Now all fields of U have been initialized.  */

  if (lines == (struct line *) (uintptr_t) -1)
    {
      /* If reading the line number information failed in some way,
	 try again to see if there is a better compilation unit for
	 this PC.  */
      if (new_data)
	return dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				data, found);
      return callback (data, pc, NULL, 0, NULL);
    }

  /* Search for PC within this unit.  */

  ln = (struct line *) bsearch (&pc, lines, entry->u->lines_count,
				sizeof (struct line), line_search);
  if (ln == NULL)
    {
      /* The PC is between the low_pc and high_pc attributes of the
	 compilation unit, but no entry in the line table covers it.
	 This implies that the start of the compilation unit has no
	 line number information.  */

      if (entry->u->abs_filename == NULL)
	{
	  const char *filename;

	  filename = entry->u->filename;
	  if (filename != NULL
	      && !IS_ABSOLUTE_PATH (filename)
	      && entry->u->comp_dir != NULL)
	    {
	      size_t filename_len;
	      const char *dir;
	      size_t dir_len;
	      char *s;

	      filename_len = strlen (filename);
	      dir = entry->u->comp_dir;
	      dir_len = strlen (dir);
	      s = (char *) backtrace_alloc (state, dir_len + filename_len + 2,
					    error_callback, data);
	      if (s == NULL)
		{
		  *found = 0;
		  return 0;
		}
	      memcpy (s, dir, dir_len);
	      /* FIXME: Should use backslash if DOS file system.  */
	      s[dir_len] = '/';
	      memcpy (s + dir_len + 1, filename, filename_len + 1);
	      filename = s;
	    }
	  entry->u->abs_filename = filename;
	}

      return callback (data, pc, entry->u->abs_filename, 0, NULL);
    }

  /* Search for function name within this unit.  */

  if (entry->u->function_addrs_count == 0)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  p = ((struct function_addrs *)
       bsearch (&pc, entry->u->function_addrs,
		entry->u->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  fmatch = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  fmatch = p;
	  break;
	}
      if (p == entry->u->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (fmatch == NULL)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  function = fmatch->function;

  filename = ln->filename;
  lineno = ln->lineno;

  ret = report_inlined_functions (pc, function, callback, data,
				  &filename, &lineno);
  if (ret != 0)
    return ret;

  return callback (data, pc, filename, lineno, function->name);
}